

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iadst16_stage5_avx2(__m256i *x)

{
  __m256i *in_stack_00000040;
  __m256i *in_stack_00000048;
  
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  btf_16_adds_subs_avx2(in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

static inline void iadst16_stage5_avx2(__m256i *x) {
  btf_16_adds_subs_avx2(&x[0], &x[4]);
  btf_16_adds_subs_avx2(&x[1], &x[5]);
  btf_16_adds_subs_avx2(&x[2], &x[6]);
  btf_16_adds_subs_avx2(&x[3], &x[7]);
  btf_16_adds_subs_avx2(&x[8], &x[12]);
  btf_16_adds_subs_avx2(&x[9], &x[13]);
  btf_16_adds_subs_avx2(&x[10], &x[14]);
  btf_16_adds_subs_avx2(&x[11], &x[15]);
}